

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O1

void __thiscall
hwtest::pgraph::MthdKelvinTlProgramStartPos::emulate_mthd(MthdKelvinTlProgramStartPos *this)

{
  pgraph_state *state;
  int iVar1;
  uint uVar2;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  iVar1 = pgraph_3d_class(state);
  if (iVar1 < 6) {
    pgraph_kelvin_check_err18(state);
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type < 0x40) {
    *(char *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_a + 1)
         = (char)uVar2;
    pgraph_flush_xf_mode(state);
    return;
  }
  uVar2 = uVar2 & 0x3ff |
          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_c & 0xfffffc00;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_c = uVar2;
  pgraph_bundle(state,0x5f,0,uVar2,true);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		if (pgraph_3d_class(&exp) < PGRAPH_3D_CURIE)
			pgraph_kelvin_check_err18(&exp);
		if (!exp.nsource) {
			if (chipset.card_type < 0x40) {
				// Ummm.... won't fit on Rankine.
				insrt(exp.xf_mode_a, 8, 8, val);
				pgraph_flush_xf_mode(&exp);
			} else {
				insrt(exp.bundle_xf_c, 0, 10, val);
				pgraph_bundle(&exp, BUNDLE_XF_C, 0, exp.bundle_xf_c, true);
			}
		}
	}